

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_graph_utilities.cpp
# Opt level: O0

void __thiscall
test_graph_utilities_level_traversal_multi_start_vertex_Test::
~test_graph_utilities_level_traversal_multi_start_vertex_Test
          (test_graph_utilities_level_traversal_multi_start_vertex_Test *this)

{
  test_graph_utilities_level_traversal_multi_start_vertex_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(test_graph_utilities, level_traversal_multi_start_vertex) {
  Adjacency_Graph<false> graph_saad = create_graph_saad();

  std::vector<std::size_t> levels(graph_saad.size_vertex(), std::numeric_limits<std::size_t>::max());
  levels[0] = 0;
  levels[1] = 0;
  levels[3] = 0;
  std::queue<size_t> queue({0, 1, 3});
  level_traversal(graph_saad, queue, levels);
  std::vector<std::size_t> expected_levels = {0, 0, 2, 0, 2, 2, 1, 1, 1, 2, 1, 1, 1, 2, 1};
  EXPECT_EQ(expected_levels, levels);
}